

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

bool __thiscall Tetris::same(Tetris *this,Tetris *x)

{
  int *piVar1;
  int iVar2;
  int (*paiVar3) [8];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  int aiStack_28 [2];
  pair<int,_int> hash [4];
  
  if (this->blockType == x->blockType) {
    hash[1].first = 0;
    hash[1].second = 0;
    hash[2].first = 0;
    hash[2].second = 0;
    hash[0].first = 0;
    hash[0].second = 0;
    iVar2 = this->orientation;
    iVar4 = this->blockX;
    iVar5 = this->blockY;
    paiVar3 = this->shape;
    lVar10 = 0;
    do {
      piVar1 = paiVar3[iVar2] + lVar10 * 2;
      iVar6 = piVar1[1];
      iVar7 = piVar1[2];
      iVar8 = piVar1[3];
      hash[lVar10 + -1].first = *piVar1 + iVar4;
      hash[lVar10 + -1].second = iVar6 + iVar5;
      hash[lVar10].first = iVar7 + iVar4;
      hash[lVar10].second = iVar8 + iVar5;
      lVar10 = lVar10 + 2;
    } while (lVar10 != 4);
    uVar11 = 0;
    bVar13 = false;
    do {
      uVar12 = 0;
      bVar9 = false;
      do {
        if ((hash[uVar12 - 1].first == x->shape[x->orientation][uVar11 * 2] + x->blockX) &&
           (hash[uVar12 - 1].second == x->shape[x->orientation][uVar11 * 2 + 1] + x->blockY)) {
          bVar9 = true;
        }
      } while ((uVar12 < 3) && (uVar12 = uVar12 + 1, !bVar9));
      if (!bVar9) {
        return bVar13;
      }
      bVar13 = 2 < uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 4);
  }
  else {
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

bool Tetris::same(const Tetris &x)
{
    if (blockType != x.blockType)
        return false;
    pair<int, int> hash[4];
    int i, tmpX, tmpY;
    for (i = 0; i < 4; i++) {
        tmpX = blockX + shape[orientation][2 * i];
        tmpY = blockY + shape[orientation][2 * i + 1];
        hash[i].first = tmpX, hash[i].second = tmpY;
    }
    for (i = 0; i < 4; i++) {
        tmpX = x.blockX + x.shape[x.orientation][2 * i];
        tmpY = x.blockY + x.shape[x.orientation][2 * i + 1];
        bool ok = false;
        for (int j = 0; j < 4 && !ok; ++j)
            if (hash[j].first == tmpX && hash[j].second == tmpY)
                ok = true;
        if (!ok)
            return false;
    }
    return true;
}